

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QWidget * embeddedWidget(QWidget *w)

{
  long lVar1;
  bool bVar2;
  QWidget *pQVar3;
  QAbstractSpinBox *this;
  QAbstractScrollArea *pQVar4;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QAbstractScrollArea *sa;
  QAbstractSpinBox *sb;
  QComboBox *cmb;
  undefined8 in_stack_ffffffffffffffb8;
  FindChildOption flags;
  QAbstractScrollArea *in_stack_ffffffffffffffc0;
  QObject *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffe8;
  QFlagsStorage<Qt::FindChildOption> options;
  
  options.i = (Int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  flags = (FindChildOption)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = &qobject_cast<QComboBox*>((QObject *)0x42aa61)->super_QWidget;
  if (pQVar3 == (QWidget *)0x0) {
    this = qobject_cast<QAbstractSpinBox*>((QObject *)0x42aaa8);
    if (this == (QAbstractSpinBox *)0x0) {
      pQVar4 = qobject_cast<QAbstractScrollArea*>((QObject *)0x42aaed);
      pQVar3 = in_RDI;
      if (pQVar4 != (QAbstractScrollArea *)0x0) {
        pQVar3 = QAbstractScrollArea::viewport(in_stack_ffffffffffffffc0);
      }
    }
    else {
      QFlags<Qt::FindChildOption>::QFlags((QFlags<Qt::FindChildOption> *)this,flags);
      pQVar3 = &QObject::findChild<QLineEdit*>
                          (in_stack_ffffffffffffffc8,(FindChildOptions)options.i)->super_QWidget;
    }
  }
  else {
    bVar2 = QComboBox::isEditable((QComboBox *)in_stack_ffffffffffffffc0);
    if (bVar2) {
      pQVar3 = &QComboBox::lineEdit((QComboBox *)in_stack_ffffffffffffffc0)->super_QWidget;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pQVar3;
}

Assistant:

static QWidget *embeddedWidget(QWidget *w)
{
#if QT_CONFIG(combobox)
    if (QComboBox *cmb = qobject_cast<QComboBox *>(w)) {
        if (cmb->isEditable())
            return cmb->lineEdit();
        else
            return cmb;
    }
#endif

#if QT_CONFIG(spinbox)
    if (QAbstractSpinBox *sb = qobject_cast<QAbstractSpinBox *>(w))
        return sb->findChild<QLineEdit *>();
#endif

#if QT_CONFIG(scrollarea)
    if (QAbstractScrollArea *sa = qobject_cast<QAbstractScrollArea *>(w))
        return sa->viewport();
#endif

    return w;
}